

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

_compatible_internalformat_pairs *
gl4cts::TextureViewUtilities::getLegalTextureAndViewInternalformatCombinations(void)

{
  _view_class view_class;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *in_RDI;
  pointer puVar1;
  pointer puVar2;
  _internalformats view_class_internalformats;
  _internalformats local_50;
  pair<unsigned_int,_unsigned_int> local_38;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  view_class = VIEW_CLASS_128_BITS;
  do {
    getInternalformatsFromViewClass(&local_50,view_class);
    for (puVar1 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar2 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        puVar1 != local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
      for (; puVar2 != local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
        local_38.first = *puVar1;
        local_38.second = *puVar2;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::emplace_back<std::pair<unsigned_int,unsigned_int>>(in_RDI,&local_38);
      }
    }
    if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    view_class = view_class + VIEW_CLASS_96_BITS;
  } while (view_class != VIEW_CLASS_COUNT);
  return (_compatible_internalformat_pairs *)in_RDI;
}

Assistant:

TextureViewUtilities::_compatible_internalformat_pairs TextureViewUtilities::
	getLegalTextureAndViewInternalformatCombinations()
{
	_compatible_internalformat_pairs result;

	/* Iterate over all view classes */
	for (int current_view_class_it = static_cast<int>(VIEW_CLASS_FIRST);
		 current_view_class_it != static_cast<int>(VIEW_CLASS_COUNT); current_view_class_it++)
	{
		_view_class		 current_view_class			= static_cast<_view_class>(current_view_class_it);
		_internalformats view_class_internalformats = getInternalformatsFromViewClass(current_view_class);

		/* Store all combinations in the result vector */
		for (_internalformats_const_iterator left_iterator = view_class_internalformats.begin();
			 left_iterator != view_class_internalformats.end(); left_iterator++)
		{
			for (_internalformats_const_iterator right_iterator = view_class_internalformats.begin();
				 right_iterator != view_class_internalformats.end(); ++right_iterator)
			{
				result.push_back(_internalformat_pair(*left_iterator, *right_iterator));
			} /* for (all internalformats to be used as right-side values) */
		}	 /* for (all internalformats to be used as left-side values) */
	}		  /* for (all view classes) */

	return result;
}